

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gecko.cpp
# Opt level: O2

ssize_t __thiscall ChacoGraph::read(ChacoGraph *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  undefined8 uVar5;
  string *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  ostream *poVar8;
  ulong uVar9;
  uint uVar10;
  undefined4 in_register_00000034;
  float fVar11;
  allocator aStack_1024a;
  allocator aStack_10249;
  ChacoGraph *pCStack_10248;
  uint fmt;
  uint nv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_10238;
  uint ne;
  int n;
  double w;
  uint j;
  ostringstream ss;
  string message;
  
  pCStack_10248 = this;
  pcVar4 = fgets((char *)&message,0x10000,(FILE *)CONCAT44(in_register_00000034,__fd));
  if (pcVar4 == (char *)0x0) {
    psVar6 = (string *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string(psVar6,"file is empty",(allocator *)&ss);
    __cxa_throw(psVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  bVar1 = false;
  iVar2 = sscanf((char *)&message,"%u%u%u",&nv,&ne,&fmt);
  if (iVar2 != 2) {
    if (iVar2 != 3) {
      psVar6 = (string *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string(psVar6,"invalid first line in graph file",(allocator *)&ss);
      __cxa_throw(psVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    if (fmt == 0) {
      bVar1 = false;
    }
    else {
      if (fmt != 1) {
        psVar6 = (string *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string(psVar6,"invalid graph format specifier",(allocator *)&ss);
        __cxa_throw(psVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      bVar1 = true;
    }
  }
  uVar10 = 1;
  do {
    if (nv < uVar10) {
      uVar5 = Gecko::Graph::directed();
      if ((int)uVar5 == 0) {
        return CONCAT71((int7)((ulong)uVar5 >> 8),1);
      }
      Gecko::Graph::arc_source((uint)pCStack_10248);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&ss);
      poVar8 = std::operator<<(poVar8,", ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      std::__cxx11::string::string((string *)&w,"no arc (",&aStack_10249);
      std::__cxx11::stringbuf::str();
      std::operator+(&bStack_10238,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&w,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&n);
      std::__cxx11::string::string((string *)&j,"): graph is directed",&aStack_1024a);
      std::operator+(pbVar7,&bStack_10238,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&j);
      __cxa_throw(pbVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    uVar3 = Gecko::Graph::insert_node(1.0);
    if (uVar3 != uVar10) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
      std::ostream::_M_insert<unsigned_long>((ulong)&ss);
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      std::__cxx11::stringbuf::str();
      std::operator+(pbVar7,"cannot insert node",&bStack_10238);
      __cxa_throw(pbVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    do {
      pcVar4 = fgets((char *)&message,0x10000,(FILE *)CONCAT44(in_register_00000034,__fd));
      if (pcVar4 == (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        std::ostream::_M_insert<unsigned_long>((ulong)&ss);
        pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
        std::__cxx11::stringbuf::str();
        std::operator+(pbVar7,"no data for node",&bStack_10238);
        __cxa_throw(pbVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
    } while (((char)message._M_dataplus._M_p == '#') || ((char)message._M_dataplus._M_p == '%'));
    uVar9 = 0;
    while( true ) {
      uVar3 = (uint)uVar9;
      iVar2 = sscanf((char *)((long)&message._M_dataplus._M_p + uVar9),"%u%n",&j,&n);
      if (iVar2 != 1) break;
      w = 1.0;
      if (bVar1) {
        uVar3 = uVar3 + n;
        iVar2 = sscanf((char *)((long)&message._M_dataplus._M_p + (ulong)uVar3),"%lf%n",&w,&n);
        if (iVar2 != 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
          std::ostream::_M_insert<unsigned_long>((ulong)&ss);
          pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __cxa_allocate_exception(0x20);
          std::__cxx11::stringbuf::str();
          std::operator+(pbVar7,"cannot read weight for node",&bStack_10238);
          __cxa_throw(pbVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        fVar11 = (float)w;
      }
      else {
        fVar11 = 1.0;
      }
      iVar2 = Gecko::Graph::insert_arc((uint)pCStack_10248,uVar10,fVar11,fVar11);
      if (iVar2 == 0) {
        psVar6 = (string *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string(psVar6,"arc insertion failed",(allocator *)&ss);
        __cxa_throw(psVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      uVar9 = (ulong)(uVar3 + n);
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

bool
ChacoGraph::read(FILE* file)
{
  try {
    char line[0x10000];
    if (!fgets(line, sizeof(line), file))
      throw std::string("file is empty");

    // determine number of nodes, edges, and type of graph
    unsigned int nv, ne, fmt;
    bool weighted = false;
    switch (sscanf(line, "%u%u%u", &nv, &ne, &fmt)) {
      case 2:
        break;
      case 3:
        switch (fmt) {
          case 0:
            break;
          case 1:
            weighted = true;
            break;
          default:
            throw std::string("invalid graph format specifier");
        }
        break;
      default:
        throw std::string("invalid first line in graph file");
    }

    // read nodes and their neighbors
    for (Node::Index i = 1; i <= nv; i++) {
      if (insert_node() != i) {
        std::ostringstream ss;
        ss << i;
        throw std::string("cannot insert node" + ss.str());
      }
      do {
        if (!fgets(line, sizeof(line), file)) {
          std::ostringstream ss;
          ss << i;
          throw std::string("no data for node" + ss.str());
        }
      } while (line[0] == '%' || line[0] == '#');
      int n;
      for (unsigned int k = 0, j; sscanf(line + k, "%u%n", &j, &n) == 1; k += n) {
        double w = 1;
        if (weighted) {
          k += n;
          if (sscanf(line + k, "%lf%n", &w, &n) != 1) {
            std::ostringstream ss;
            ss << i;
            throw std::string("cannot read weight for node" + ss.str());
          }
        }
        if (!insert_arc(i, j, Float(w), Float(w)))
          throw std::string("arc insertion failed");
      }
    }

    // make sure graph is undirected
    Arc::Index a = directed();
    if (a) {
      Node::Index i = arc_source(a);
      Node::Index j = arc_target(a);
      std::ostringstream ss;
      ss << i << ", " << j;
      throw std::string("no arc (") + ss.str() + std::string("): graph is directed");
    }
  }
  catch (std::string message) {
    std::cerr << "ERROR: " << message << std::endl;
    return false;
  }

  return true;
}